

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.h
# Opt level: O0

void __thiscall FIX::FileLogFactory::FileLogFactory(FileLogFactory *this,SessionSettings *settings)

{
  SessionSettings *settings_local;
  FileLogFactory *this_local;
  
  LogFactory::LogFactory((LogFactory *)this);
  *(undefined **)this = &SocketAcceptor::typeinfo;
  std::__cxx11::string::string((string *)(this + 8));
  std::__cxx11::string::string((string *)(this + 0x28));
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x48),settings);
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined4 *)(this + 0xe0) = 0;
  return;
}

Assistant:

FileLogFactory(const SessionSettings &settings)
      : m_settings(settings),
        m_globalLog(0),
        m_globalLogCount(0) {}